

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetWindowFontScale(float scale)

{
  ImGuiWindow_conflict *pIVar1;
  ImGuiContext_conflict1 *pIVar2;
  ImGuiContext_conflict1 *g;
  float fVar3;
  
  pIVar2 = GImGui;
  if (0.0 < scale) {
    pIVar1 = GImGui->CurrentWindow;
    pIVar1->WriteAccessed = true;
    pIVar1->FontWindowScale = scale;
    fVar3 = scale * pIVar2->FontBaseSize * pIVar1->FontDpiScale;
    if (pIVar1->ParentWindow != (ImGuiWindow_conflict *)0x0) {
      fVar3 = fVar3 * pIVar1->ParentWindow->FontWindowScale;
    }
    (pIVar2->DrawListSharedData).FontSize = fVar3;
    pIVar2->FontSize = fVar3;
    return;
  }
  __assert_fail("scale > 0.0f",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x1de4,"void ImGui::SetWindowFontScale(float)");
}

Assistant:

void ImGui::SetWindowFontScale(float scale)
{
    IM_ASSERT(scale > 0.0f);
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    window->FontWindowScale = scale;
    g.FontSize = g.DrawListSharedData.FontSize = window->CalcFontSize();
}